

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void FStateDefinitions::MakeStateList(FStateLabels *list,TArray<FStateDefine,_FStateDefine> *dest)

{
  FStateLabels *list_00;
  uint uVar1;
  FStateDefine *pFVar2;
  undefined1 local_48 [8];
  FStateDefine def;
  int i;
  TArray<FStateDefine,_FStateDefine> *dest_local;
  FStateLabels *list_local;
  
  TArray<FStateDefine,_FStateDefine>::Clear(dest);
  if (list != (FStateLabels *)0x0) {
    for (def._36_4_ = 0; (int)def._36_4_ < list->NumLabels; def._36_4_ = def._36_4_ + 1) {
      FStateDefine::FStateDefine((FStateDefine *)local_48);
      FName::operator=((FName *)local_48,&list->Labels[(int)def._36_4_].Label);
      def.Children._8_8_ = list->Labels[(int)def._36_4_].State;
      def.State._0_1_ = 1;
      TArray<FStateDefine,_FStateDefine>::Push(dest,(FStateDefine *)local_48);
      if (list->Labels[(int)def._36_4_].Children != (FStateLabels *)0x0) {
        list_00 = list->Labels[(int)def._36_4_].Children;
        uVar1 = TArray<FStateDefine,_FStateDefine>::Size(dest);
        pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](dest,(ulong)(uVar1 - 1));
        MakeStateList(list_00,&pFVar2->Children);
      }
      FStateDefine::~FStateDefine((FStateDefine *)local_48);
    }
  }
  return;
}

Assistant:

void FStateDefinitions::MakeStateList(const FStateLabels *list, TArray<FStateDefine> &dest)
{
	dest.Clear();
	if (list != NULL) for (int i = 0; i < list->NumLabels; i++)
	{
		FStateDefine def;

		def.Label = list->Labels[i].Label;
		def.State = list->Labels[i].State;
		def.DefineFlags = SDF_STATE;
		dest.Push(def);
		if (list->Labels[i].Children != NULL)
		{
			MakeStateList(list->Labels[i].Children, dest[dest.Size()-1].Children);
		}
	}
}